

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkingUtils.cpp
# Opt level: O3

unsigned_long GetHostByName(char *name)

{
  hostent *phVar1;
  unsigned_long uVar2;
  in_addr a;
  uint local_c;
  
  phVar1 = gethostbyname(name);
  if (phVar1 == (hostent *)0x0) {
    uVar2 = 0;
  }
  else {
    memcpy(&local_c,*phVar1->h_addr_list,(long)phVar1->h_length);
    uVar2 = (unsigned_long)
            (local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 | local_c << 0x18
            );
  }
  return uVar2;
}

Assistant:

unsigned long GetHostByName( const char *name )
{
    unsigned long result = 0;

    struct hostent *h = gethostbyname( name );
    if( h ){
        struct in_addr a;
        std::memcpy( &a, h->h_addr_list[0], h->h_length );
        result = ntohl(a.s_addr);
    }

    return result;
}